

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_special(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  uint uVar2;
  int it;
  long in_RAX;
  BYTE *pBVar3;
  char *pcVar4;
  int min_args;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  uVar1 = FCommandLine::argc(argv);
  if (uVar1 - 8 < 0xfffffffa) {
    pcVar4 = "Usage: special <special-name> [arg1] [arg2] [arg3] [arg4] [arg5]\n";
LAB_004a2658:
    Printf(pcVar4);
    return;
  }
  pcVar4 = FCommandLine::operator[](argv,1);
  if ((*pcVar4 < '0') || (pcVar4 = FCommandLine::operator[](argv,1), '9' < *pcVar4)) {
    pcVar4 = FCommandLine::operator[](argv,1);
    uVar2 = P_FindLineSpecial(pcVar4,(int *)((long)&uStack_28 + 4),(int *)0x0);
    if (uStack_28 < 0 || uVar2 == 0) {
      Printf("Unknown special\n");
      return;
    }
    if (uVar1 < uStack_28._4_4_ + 2) {
      pcVar4 = FCommandLine::operator[](argv,1);
      pBVar3 = "s";
      if (uStack_28._4_4_ == 1) {
        pBVar3 = "";
      }
      Printf("%s needs at least %d argument%s\n",pcVar4,(ulong)uStack_28._4_4_,pBVar3);
      return;
    }
  }
  else {
    pcVar4 = FCommandLine::operator[](argv,1);
    uVar2 = atoi(pcVar4);
    if (0xff < uVar2) {
      pcVar4 = "Bad special number\n";
      goto LAB_004a2658;
    }
  }
  Net_WriteByte('>');
  Net_WriteWord((short)uVar2);
  Net_WriteByte((char)uVar1 + 0xfe);
  if (2 < uVar1) {
    uVar2 = 2;
    do {
      pcVar4 = FCommandLine::operator[](argv,uVar2);
      it = atoi(pcVar4);
      Net_WriteLong(it);
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

CCMD (special)
{
	int argc = argv.argc();

	if (argc < 2 || argc > 7)
	{
		Printf("Usage: special <special-name> [arg1] [arg2] [arg3] [arg4] [arg5]\n");
	}
	else
	{
		int specnum;

		if (argv[1][0] >= '0' && argv[1][0] <= '9')
		{
			specnum = atoi(argv[1]);
			if (specnum < 0 || specnum > 255)
			{
				Printf("Bad special number\n");
				return;
			}
		}
		else
		{
			int min_args;
			specnum = P_FindLineSpecial(argv[1], &min_args);
			if (specnum == 0 || min_args < 0)
			{
				Printf("Unknown special\n");
				return;
			}
			if (argc < 2 + min_args)
			{
				Printf("%s needs at least %d argument%s\n", argv[1], min_args, min_args == 1 ? "" : "s");
				return;
			}
		}
		Net_WriteByte(DEM_RUNSPECIAL);
		Net_WriteWord(specnum);
		Net_WriteByte(argc - 2);
		for (int i = 2; i < argc; ++i)
		{
			Net_WriteLong(atoi(argv[i]));
		}
	}
}